

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2dcf93::ArrayType::printRight(ArrayType *this,OutputStream *S)

{
  long *__src;
  void *pvVar1;
  size_t N;
  
  if ((S->CurrentPosition == 0) || (S->Buffer[S->CurrentPosition - 1] != ']')) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ' ';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '[';
  S->CurrentPosition = S->CurrentPosition + 1;
  __src = (long *)(this->Dimension).First;
  pvVar1 = (this->Dimension).Second;
  if (__src == (long *)0x0 || pvVar1 == (void *)0x0) {
    if (pvVar1 == (void *)0x0 && __src != (long *)0x0) {
      (**(code **)(*__src + 0x20))(__src,S);
      if (*(char *)((long)__src + 9) != '\x01') {
        (**(code **)(*__src + 0x28))(__src,S);
      }
    }
  }
  else {
    N = (long)pvVar1 - (long)__src;
    if (N != 0) {
      OutputStream::grow(S,N);
      memmove(S->Buffer + S->CurrentPosition,__src,N);
      S->CurrentPosition = S->CurrentPosition + N;
    }
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ']';
  S->CurrentPosition = S->CurrentPosition + 1;
  (*this->Base->_vptr_Node[5])(this->Base,S);
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    if (S.back() != ']')
      S += " ";
    S += "[";
    if (Dimension.isString())
      S += Dimension.asString();
    else if (Dimension.isNode())
      Dimension.asNode()->print(S);
    S += "]";
    Base->printRight(S);
  }